

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_constant.hpp
# Opt level: O0

ostream * viennamath::operator<<(ostream *stream,ct_constant<1L> *c)

{
  string local_38;
  ct_constant<1L> *local_18;
  ct_constant<1L> *c_local;
  ostream *stream_local;
  
  local_18 = c;
  c_local = (ct_constant<1L> *)stream;
  ct_constant<1l>::str_abi_cxx11_(&local_38,c);
  std::operator<<(stream,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)c_local;
}

Assistant:

std::ostream& operator<<(std::ostream & stream,
                           ct_constant<value_> const & c)
  {
    stream << c.str();
    return stream;
  }